

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_and_expr(lyxp_expr *exp,uint16_t *exp_idx,uint16_t repeat,lyd_node *cur_node,
                 lys_module *param_5,lyxp_set *set,int options)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  ushort local_ca;
  undefined1 local_c8 [6];
  uint16_t i;
  lyxp_set set2;
  lyxp_set orig_set;
  int local_3c;
  int ret;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t repeat_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  if (repeat == 0) {
    __assert_fail("repeat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x201e,
                  "int eval_and_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                 );
  }
  memset(&set2.field_0x38,0,0x40);
  memset(local_c8,0,0x40);
  set_fill_set((lyxp_set *)&set2.field_0x38,set);
  local_3c = eval_expr_select(exp,exp_idx,LYXP_EXPR_AND,cur_node,param_5,set,options);
  if (local_3c == 0) {
    if ((set == (lyxp_set *)0x0) || ((options & 0x1cU) == 0)) {
      lyxp_set_cast(set,LYXP_SET_BOOLEAN,cur_node,param_5,options);
    }
    else {
      set_snode_clear_ctx(set);
    }
    for (local_ca = 0; local_ca < repeat; local_ca = local_ca + 1) {
      if (exp->tokens[*exp_idx] != LYXP_TOKEN_OPERATOR_LOG) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_LOG",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x2033,
                      "int eval_and_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      bVar3 = true;
      if (set != (lyxp_set *)0x0) {
        bVar3 = (set->val).bool == 0;
      }
      pcVar1 = "parsed";
      if (bVar3) {
        pcVar1 = "skipped";
      }
      pcVar2 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_and_expr",pcVar1,pcVar2);
      *exp_idx = *exp_idx + 1;
      if ((set == (lyxp_set *)0x0) || ((set->type == LYXP_SET_BOOLEAN && ((set->val).bool == 0)))) {
        local_3c = eval_expr_select(exp,exp_idx,LYXP_EXPR_AND,cur_node,param_5,(lyxp_set *)0x0,
                                    options);
        if (local_3c != 0) break;
      }
      else {
        set_fill_set((lyxp_set *)local_c8,(lyxp_set *)&set2.field_0x38);
        local_3c = eval_expr_select(exp,exp_idx,LYXP_EXPR_AND,cur_node,param_5,(lyxp_set *)local_c8,
                                    options);
        if (local_3c != 0) break;
        if (set->type == LYXP_SET_SNODE_SET) {
          set_snode_clear_ctx((lyxp_set *)local_c8);
          set_snode_merge(set,(lyxp_set *)local_c8);
        }
        else {
          lyxp_set_cast((lyxp_set *)local_c8,LYXP_SET_BOOLEAN,cur_node,param_5,options);
          set_fill_set(set,(lyxp_set *)local_c8);
        }
      }
    }
  }
  lyxp_set_cast((lyxp_set *)&set2.field_0x38,LYXP_SET_EMPTY,cur_node,param_5,options);
  lyxp_set_cast((lyxp_set *)local_c8,LYXP_SET_EMPTY,cur_node,param_5,options);
  return local_3c;
}

Assistant:

static int
eval_and_expr(struct lyxp_expr *exp, uint16_t *exp_idx, uint16_t repeat, struct lyd_node *cur_node,
              struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    int ret;
    struct lyxp_set orig_set, set2;
    uint16_t i;

    assert(repeat);

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    set_fill_set(&orig_set, set);

    ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_AND, cur_node, local_mod, set, options);
    if (ret) {
        goto finish;
    }

    /* cast to boolean, we know that will be the final result */
    if (set && (options & LYXP_SNODE_ALL)) {
        set_snode_clear_ctx(set);
    } else {
        lyxp_set_cast(set, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
    }

    /* ('and' EqualityExpr)* */
    for (i = 0; i < repeat; ++i) {
        assert(exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_LOG);
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (!set || !set->val.bool ? "skipped" : "parsed"),
            print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        /* lazy evaluation */
        if (!set || ((set->type == LYXP_SET_BOOLEAN) && !set->val.bool)) {
            ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_AND, cur_node, local_mod, NULL, options);
            if (ret) {
                goto finish;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_AND, cur_node, local_mod, &set2, options);
        if (ret) {
            goto finish;
        }

        /* eval - just get boolean value actually */
        if (set->type == LYXP_SET_SNODE_SET) {
            set_snode_clear_ctx(&set2);
            set_snode_merge(set, &set2);
        } else {
            lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
            set_fill_set(set, &set2);
        }
    }

finish:
    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
    return ret;
}